

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

int __thiscall
CVmObjByteArray::index_val_q
          (CVmObjByteArray *this,vm_val_t *result,vm_obj_id_t self,vm_val_t *index_val)

{
  uint uVar1;
  ulong uVar2;
  unsigned_long uVar3;
  byte *pbVar4;
  CVmObjByteArray *in_RCX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  uchar *p;
  size_t avail;
  int32_t idx;
  size_t *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  
  uVar1 = vm_val_t::num_to_int(in_RDI);
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
    uVar3 = get_element_count((CVmObjByteArray *)0x2c6348);
    if (uVar2 <= uVar3) {
      pbVar4 = get_ele_ptr(in_RCX,CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                           in_stack_ffffffffffffffd0);
      vm_val_t::set_int(in_RSI,(uint)*pbVar4);
      return 1;
    }
  }
  err_throw(0);
}

Assistant:

int CVmObjByteArray::index_val_q(VMG_ vm_val_t *result, vm_obj_id_t self,
                                 const vm_val_t *index_val)
{
    /* get the index */
    int32_t idx = index_val->num_to_int(vmg0_);

    /* make sure it's in range */
    if (idx < 1 || (uint32_t)idx > get_element_count())
        err_throw(VMERR_INDEX_OUT_OF_RANGE);
    
    /* get a pointer to the desired element */
    size_t avail;
    unsigned char *p = get_ele_ptr(idx, &avail);

    /* return the value as an integer */
    result->set_int((int)(unsigned short)*p);

    /* handled */
    return TRUE;
}